

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.c
# Opt level: O0

int mp_snprint_ext_default(char *buf,int size,char **data,int depth)

{
  int iVar1;
  uint local_2c;
  char local_25;
  uint32_t len;
  int8_t type;
  char **ppcStack_20;
  int depth_local;
  char **data_local;
  char *pcStack_10;
  int size_local;
  char *buf_local;
  
  len = depth;
  ppcStack_20 = data;
  data_local._4_4_ = size;
  pcStack_10 = buf;
  mp_decode_ext(data,&local_25,&local_2c);
  iVar1 = snprintf(pcStack_10,(long)data_local._4_4_,"(extension: type %d, len %u)",
                   (ulong)(uint)(int)local_25,(ulong)local_2c);
  return iVar1;
}

Assistant:

int
mp_snprint_ext_default(char *buf, int size, const char **data, int depth)
{
	(void) depth;
	int8_t type;
	uint32_t len;
	mp_decode_ext(data, &type, &len);
	return snprintf(buf, size, "(extension: type %d, len %u)", (int)type,
			(unsigned)len);
}